

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O1

int ffwrhdu(fitsfile *infptr,FILE *outstream,int *status)

{
  long lVar1;
  LONGLONG hduend;
  LONGLONG hdustart;
  char buffer [2880];
  long local_b78;
  long local_b70;
  undefined1 local_b68 [2880];
  
  if (0 < *status) {
    return *status;
  }
  ffghadll(infptr,&local_b70,(LONGLONG *)0x0,&local_b78,status);
  if (0xb3f < local_b78 - local_b70) {
    lVar1 = (local_b78 - local_b70) / 0xb40;
    ffmbyt(infptr,local_b70,0,status);
    do {
      ffgbyt(infptr,0xb40,local_b68,status);
      fwrite(local_b68,1,0xb40,(FILE *)outstream);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return *status;
}

Assistant:

int ffwrhdu(fitsfile *infptr,    /* I - FITS file pointer to input file  */
            FILE *outstream,     /* I - stream to write HDU to */
            int *status)         /* IO - error status     */
{
/*
  write the data unit from the CHDU of infptr to the output file stream
*/
    long nb, ii;
    LONGLONG hdustart, hduend;
    char buffer[2880];

    if (*status > 0)
        return(*status);

    ffghadll(infptr, &hdustart,  NULL, &hduend, status);

    nb = (long) ((hduend - hdustart) / 2880);  /* number of blocks to copy */

    if (nb > 0)
    {

        /* move to the start of the HDU */
        ffmbyt(infptr,  hdustart,  REPORT_EOF, status);

        for (ii = 0; ii < nb; ii++)
        {
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */
            fwrite(buffer, 1, 2880, outstream ); /* write to output stream */
        }
    }
    return(*status);
}